

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

bool EV_RotatePoly(line_t_conflict *line,int polyNum,int speed,int byteAngle,int direction,
                  bool overRide)

{
  bool bVar1;
  size_t len;
  undefined1 local_1e0 [8];
  FPolyMirrorIterator it;
  FPolyObj *poly;
  DRotatePoly *pe;
  int local_28;
  bool overRide_local;
  int direction_local;
  int byteAngle_local;
  int speed_local;
  int polyNum_local;
  line_t_conflict *line_local;
  
  poly = (FPolyObj *)0x0;
  it._408_8_ = PO_GetPolyobj(polyNum);
  if ((FPolyObj *)it._408_8_ == (FPolyObj *)0x0) {
    Printf("EV_RotatePoly: Invalid polyobj num: %d\n",(ulong)(uint)polyNum);
    line_local._7_1_ = false;
  }
  else {
    FPolyMirrorIterator::FPolyMirrorIterator
              ((FPolyMirrorIterator *)local_1e0,(FPolyObj *)it._408_8_);
    local_28 = direction;
    while (it._408_8_ = FPolyMirrorIterator::NextMirror((FPolyMirrorIterator *)local_1e0),
          (FPolyObj *)it._408_8_ != (FPolyObj *)0x0) {
      len = 0;
      bVar1 = TObjPtr<DPolyAction>::operator!=
                        (&((FPolyObj *)it._408_8_)->specialdata,(DPolyAction *)0x0);
      if ((((bVar1) || ((*(byte *)(it._408_8_ + 0xc5) & 1) != 0)) && (!overRide)) ||
         (*(char *)(it._408_8_ + 0xc6) == '\x02')) break;
      poly = (FPolyObj *)DObject::operator_new((DObject *)0x58,len);
      DRotatePoly::DRotatePoly((DRotatePoly *)poly,*(int *)(it._408_8_ + 0xa8));
      TObjPtr<DPolyAction>::operator=
                ((TObjPtr<DPolyAction> *)(it._408_8_ + 0xe0),(DPolyAction *)poly);
      *(undefined1 *)(it._408_8_ + 0xc5) = 0;
      if (byteAngle == 0) {
        *(double *)&(poly->PrevPts).Most = 360.0;
      }
      else if (byteAngle == 0xff) {
        *(double *)&(poly->PrevPts).Most = -1.0;
      }
      else {
        *(double *)&(poly->PrevPts).Most = (double)byteAngle * 1.40625;
      }
      (poly->PrevPts).Array = (FPolyVertex *)((double)(speed * local_28) * 0.17578125);
      SN_StartSequence((FPolyObj *)it._408_8_,*(int *)(it._408_8_ + 200),SEQ_DOOR,0,false);
      local_28 = -local_28;
    }
    line_local._7_1_ = poly != (FPolyObj *)0x0;
  }
  return line_local._7_1_;
}

Assistant:

bool EV_RotatePoly (line_t *line, int polyNum, int speed, int byteAngle,
					int direction, bool overRide)
{
	DRotatePoly *pe = NULL;
	FPolyObj *poly;

	if ((poly = PO_GetPolyobj(polyNum)) == NULL)
	{
		Printf("EV_RotatePoly: Invalid polyobj num: %d\n", polyNum);
		return false;
	}
	FPolyMirrorIterator it(poly);

	while ((poly = it.NextMirror()) != NULL)
	{
		if ((poly->specialdata != NULL || poly->bBlocked) && !overRide)
		{ // poly is already in motion
			break;
		}
		if (poly->bHasPortals == 2)
		{
			// cannot do rotations on linked polyportals.
			break;
		}
		pe = new DRotatePoly(poly->tag);
		poly->specialdata = pe;
		poly->bBlocked = false;
		if (byteAngle != 0)
		{
			if (byteAngle == 255)
			{
				pe->m_Dist = -1.;
			}
			else
			{
				pe->m_Dist =  byteAngle*(90./64); // Angle
			}
		}
		else
		{
			pe->m_Dist = 360.;
		}
		pe->m_Speed = speed*direction*(90./(64<<3));
		SN_StartSequence (poly, poly->seqType, SEQ_DOOR, 0);
		direction = -direction;	// Reverse the direction
	}
	return pe != NULL;	// Return true if something started moving.
}